

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O0

void cmGlobalNinjaGenerator::WriteVariable
               (ostream *os,string *name,string *value,string *comment,int indent)

{
  ulong uVar1;
  char *m2;
  ostream *poVar2;
  undefined1 local_50 [8];
  string val;
  int indent_local;
  string *comment_local;
  string *value_local;
  string *name_local;
  ostream *os_local;
  
  val.field_2._12_4_ = indent;
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    cmSystemTools::TrimWhitespace((string *)local_50,value);
    uVar1 = std::__cxx11::string::empty();
    if ((uVar1 & 1) == 0) {
      WriteComment(os,comment);
      Indent(os,val.field_2._12_4_);
      poVar2 = std::operator<<(os,(string *)name);
      poVar2 = std::operator<<(poVar2," = ");
      poVar2 = std::operator<<(poVar2,(string *)local_50);
      std::operator<<(poVar2,"\n");
    }
    std::__cxx11::string::~string((string *)local_50);
  }
  else {
    m2 = (char *)std::__cxx11::string::c_str();
    cmSystemTools::Error
              ("No name given for WriteVariable! called with comment: ",m2,(char *)0x0,(char *)0x0);
  }
  return;
}

Assistant:

void cmGlobalNinjaGenerator::WriteVariable(std::ostream& os,
                                           const std::string& name,
                                           const std::string& value,
                                           const std::string& comment,
                                           int indent)
{
  // Make sure we have a name.
  if(name.empty())
    {
    cmSystemTools::Error("No name given for WriteVariable! called "
                         "with comment: ",
                         comment.c_str());
    return;
    }

  // Do not add a variable if the value is empty.
  std::string val = cmSystemTools::TrimWhitespace(value);
  if(val.empty())
    {
    return;
    }

  cmGlobalNinjaGenerator::WriteComment(os, comment);
  cmGlobalNinjaGenerator::Indent(os, indent);
  os << name << " = " << val << "\n";
}